

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

reference<mpt::layout::graph::transform3> * __thiscall
mpt::reference<mpt::layout::graph::transform3>::operator=
          (reference<mpt::layout::graph::transform3> *this,
          reference<mpt::layout::graph::transform3> *ref)

{
  uintptr_t uVar1;
  transform3 *local_28;
  transform3 *r;
  reference<mpt::layout::graph::transform3> *ref_local;
  reference<mpt::layout::graph::transform3> *this_local;
  
  local_28 = ref->_ref;
  if (local_28 != this->_ref) {
    if ((local_28 != (transform3 *)0x0) &&
       (uVar1 = reference<mpt::transform>::type::addref(&local_28->super_type), uVar1 == 0)) {
      local_28 = (transform3 *)0x0;
    }
    if (this->_ref != (transform3 *)0x0) {
      reference<mpt::transform>::type::unref(&this->_ref->super_type);
    }
    this->_ref = local_28;
  }
  return this;
}

Assistant:

inline reference & operator= (reference const &ref)
	{
		T *r = ref._ref;
		if (r == _ref) {
			return *this;
		}
		if (r && !r->addref()) {
			r = 0;
		}
		if (_ref) _ref->unref();
		_ref = r;
		return *this;
	}